

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::create_new_file(fat *this,string *file_path,string *fat_path)

{
  char cVar1;
  short sVar2;
  boot_record *pbVar3;
  FILE *pFVar4;
  long lVar5;
  undefined1 *__ptr;
  unsigned_long uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  size_type sVar13;
  reference pvVar14;
  char *__src;
  ostream *this_00;
  undefined1 *puVar15;
  char *__s;
  undefined1 *puStack_3f0;
  ostream *local_3e8;
  FILE *local_3e0;
  int local_3d4;
  reference local_3d0;
  ulong local_3c8;
  char *local_3c0;
  reference local_3b8;
  ulong local_3b0;
  int32_t local_3a4;
  reference local_3a0;
  value_type local_394;
  reference local_390;
  reference local_388;
  long local_380;
  ulong local_378;
  ulong local_370;
  undefined1 *local_368;
  reference local_360;
  ulong local_358;
  ostream *local_350;
  reference local_348;
  reference local_340;
  ulong local_338;
  ostream *local_330;
  ostream *local_328;
  int local_31c;
  reference local_318;
  string *local_310;
  undefined8 local_308;
  string *local_300;
  undefined8 local_2f8;
  size_type local_2f0;
  int32_t local_2e4;
  ulong local_2e0;
  void *local_2d8;
  ulong local_2d0;
  allocator *local_2c8;
  size_t local_2c0;
  ostream *local_2b8;
  fat *local_2b0;
  pointer local_2a8;
  pointer piStack_2a0;
  string *local_298;
  FILE *local_290;
  ulong local_288;
  unsigned_long __vla_expr1;
  int local_278;
  int local_274;
  int i_5;
  int i_4;
  int x;
  int k;
  unsigned_long __vla_expr0;
  short local_258;
  undefined1 local_255;
  int local_254;
  int16_t i_3;
  short sStack_24e;
  char buffer [1];
  int j;
  int16_t ac_size;
  int i_2;
  long max_cluster_dirs;
  vector<fat::directory,_std::allocator<fat::directory>_> children;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [4];
  int32_t parent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [8];
  string cropped_file_name;
  string local_1c8 [32];
  string local_1a8 [8];
  string extension;
  string local_188 [32];
  string local_168 [8];
  string name;
  string local_148 [8];
  string file_name;
  int32_t local_128;
  int local_124;
  value_type local_120 [4];
  int i_1;
  value_type local_100 [36];
  int local_dc;
  int local_d8;
  int i;
  int NumSubstrings;
  string content;
  char local_b0 [8];
  long fsize;
  undefined1 auStack_98 [8];
  vector<int,_std::allocator<int>_> free_clusters;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_content;
  directory root;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  FILE *fnew;
  string *fat_path_local;
  string *file_path_local;
  fat *this_local;
  
  root.start_cluster._3_1_ = 0x2f;
  puStack_3f0 = (undefined1 *)0x10d8da;
  local_2b0 = this;
  local_298 = file_path;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_40,this,fat_path,(char *)((long)&root.start_cluster + 3));
  local_2a8 = (pointer)0x0;
  piStack_2a0 = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  split_content.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  split_content.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puStack_3f0 = (undefined1 *)0x10d8f9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_78);
  auStack_98 = (undefined1  [8])local_2a8;
  free_clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piStack_2a0;
  free_clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  puStack_3f0 = (undefined1 *)0x10d91b;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_98);
  puStack_3f0 = (undefined1 *)0x10d927;
  pcVar10 = (char *)std::__cxx11::string::c_str();
  puStack_3f0 = (undefined1 *)0x10d936;
  local_290 = fopen(pcVar10,"r");
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_290;
  if (local_290 == (FILE *)0x0) {
    puStack_3f0 = (undefined1 *)0x10d963;
    local_2b8 = std::operator<<((ostream *)&std::cout,"FILE NOT FOUND");
    puStack_3f0 = (undefined1 *)0x10d97f;
    std::ostream::operator<<(local_2b8,std::endl<char,std::char_traits<char>>);
    puStack_3f0 = &LAB_0010d98b;
    exit(1);
  }
  puStack_3f0 = (undefined1 *)0x10d9b4;
  fseek(local_290,0,2);
  puStack_3f0 = (undefined1 *)0x10d9bf;
  sVar11 = ftell((FILE *)result.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_3f0 = (undefined1 *)0x10d9e3;
  local_2c0 = sVar11;
  fseek((FILE *)result.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0);
  local_2c8 = (allocator *)((long)&i + 3);
  puStack_3f0 = (undefined1 *)0x10da06;
  local_2d0 = sVar11;
  std::allocator<char>::allocator();
  puStack_3f0 = (undefined1 *)0x10da22;
  std::__cxx11::string::string((string *)&NumSubstrings,local_2d0,'\0',local_2c8);
  puStack_3f0 = (undefined1 *)0x10da30;
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  puStack_3f0 = (undefined1 *)0x10da40;
  local_2d8 = (void *)std::__cxx11::string::operator[]((ulong)&NumSubstrings);
  puStack_3f0 = (undefined1 *)0x10da65;
  fread(local_2d8,sVar11,1,
        (FILE *)result.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_3f0 = (undefined1 *)0x10da70;
  fclose((FILE *)result.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_3f0 = (undefined1 *)0x10da7e;
  uVar12 = std::__cxx11::string::length();
  local_d8 = (int)(uVar12 / (ulong)(long)local_2b0->fs_br->cluster_size);
  for (local_dc = 0; local_dc < local_d8; local_dc = local_dc + 1) {
    puStack_3f0 = (undefined1 *)0x10daec;
    std::__cxx11::string::substr((ulong)local_100,(ulong)&NumSubstrings);
    puStack_3f0 = (undefined1 *)0x10dafe;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_78,local_100);
    puStack_3f0 = (undefined1 *)0x10db0c;
    std::__cxx11::string::~string((string *)local_100);
  }
  puStack_3f0 = (undefined1 *)0x10db86;
  uVar12 = std::__cxx11::string::length();
  if (uVar12 % (ulong)(long)local_2b0->fs_br->cluster_size != 0) {
    puStack_3f0 = (undefined1 *)0x10dbdc;
    std::__cxx11::string::substr((ulong)local_120,(ulong)&NumSubstrings);
    puStack_3f0 = (undefined1 *)0x10dbee;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_78,local_120);
    puStack_3f0 = (undefined1 *)0x10dbfc;
    std::__cxx11::string::~string((string *)local_120);
  }
  local_124 = 0;
  while( true ) {
    local_2e0 = (ulong)local_124;
    puStack_3f0 = (undefined1 *)0x10dc42;
    sVar13 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_78);
    if (sVar13 <= local_2e0) break;
    puStack_3f0 = (undefined1 *)0x10dc5d;
    local_2e4 = get_first_free_cluster(local_2b0);
    puStack_3f0 = (undefined1 *)0x10dc84;
    local_128 = local_2e4;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)auStack_98,&local_128);
    local_124 = local_124 + 1;
  }
  puStack_3f0 = (undefined1 *)0x10dca5;
  local_2f0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)auStack_98);
  puStack_3f0 = (undefined1 *)0x10dcb5;
  sVar13 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_78);
  if (local_2f0 != sVar13) {
    puStack_3f0 = (undefined1 *)0x10dce5;
    __assert_fail("free_clusters.size() == split_content.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/honzaseda[P]ZOS/fat.cpp",
                  0x7a,"void fat::create_new_file(std::string, std::string)");
  }
  local_2f8 = 0xffffffffffffffff;
  puStack_3f0 = (undefined1 *)0x10dd06;
  std::__cxx11::string::find_last_of((char *)local_298,0x118159);
  puStack_3f0 = (undefined1 *)0x10dd26;
  std::__cxx11::string::substr((ulong)local_148,(ulong)local_298);
  local_300 = local_148;
  puStack_3f0 = (undefined1 *)0x10dd49;
  std::__cxx11::string::find_last_of((char *)local_300,0x11804c);
  puStack_3f0 = (undefined1 *)0x10dd63;
  std::__cxx11::string::substr((ulong)local_188,(ulong)local_300);
  puStack_3f0 = (undefined1 *)0x10dd81;
  std::__cxx11::string::substr((ulong)local_168,(ulong)local_188);
  puStack_3f0 = (undefined1 *)0x10dd8f;
  std::__cxx11::string::~string(local_188);
  local_310 = local_148;
  local_308 = 0xffffffffffffffff;
  puStack_3f0 = (undefined1 *)0x10ddb7;
  std::__cxx11::string::find_last_of((char *)local_310,0x11804c);
  puStack_3f0 = (undefined1 *)0x10ddd7;
  std::__cxx11::string::substr((ulong)local_1c8,(ulong)local_310);
  puStack_3f0 = (undefined1 *)0x10ddf5;
  std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_1c8);
  puStack_3f0 = (undefined1 *)0x10de03;
  std::__cxx11::string::~string(local_1c8);
  puStack_3f0 = (undefined1 *)0x10de1d;
  std::operator+(local_208,(char *)local_168);
  puStack_3f0 = (undefined1 *)0x10de39;
  std::operator+(local_1e8,local_208);
  puStack_3f0 = (undefined1 *)0x10de47;
  std::__cxx11::string::~string((string *)local_208);
  root.name[0] = '\0';
  root.name[1] = '\0';
  root.name[2] = '\0';
  root.name[3] = '\0';
  root.name[4] = '\0';
  split_content.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  split_content.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  root.name[5] = '\x01';
  puStack_3f0 = (undefined1 *)0x10de67;
  pcVar10 = (char *)std::__cxx11::string::c_str();
  puStack_3f0 = (undefined1 *)0x10de73;
  strcpy((char *)&split_content.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar10);
  local_b0._0_4_ = (undefined4)sVar11;
  root.name[8] = local_b0[0];
  root.name[9] = local_b0[1];
  root.name[10] = local_b0[2];
  root.name[0xb] = local_b0[3];
  puStack_3f0 = (undefined1 *)0x10de8c;
  local_318 = std::vector<int,_std::allocator<int>_>::at
                        ((vector<int,_std::allocator<int>_> *)auStack_98,0);
  root._12_4_ = *local_318;
  puStack_3f0 = (undefined1 *)0x10deb1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  puStack_3f0 = (undefined1 *)0x10dec6;
  local_31c = get_parent_cluster(local_2b0,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&children.
                                     super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_3f0 = (undefined1 *)0x10deda;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  iVar8 = local_31c;
  if (local_31c < 0) {
    puStack_3f0 = (undefined1 *)0x10df06;
    local_328 = std::operator<<((ostream *)&std::cout,"PATH NOT FOUND");
    puStack_3f0 = (undefined1 *)0x10df22;
    std::ostream::operator<<(local_328,std::endl<char,std::char_traits<char>>);
    puStack_3f0 = &LAB_0010df2e;
    exit(1);
  }
  puStack_3f0 = (undefined1 *)0x10e02f;
  get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)&max_cluster_dirs,
                   local_2b0,local_31c);
  sVar2 = local_2b0->fs_br->cluster_size;
  puStack_3f0 = (undefined1 *)0x10e061;
  sVar13 = std::vector<fat::directory,_std::allocator<fat::directory>_>::size
                     ((vector<fat::directory,_std::allocator<fat::directory>_> *)&max_cluster_dirs);
  if ((ulong)(long)sVar2 / 0x18 <= sVar13) {
    puStack_3f0 = (undefined1 *)0x10e07d;
    local_330 = std::operator<<((ostream *)&std::cout,"DIRECTORY IS FULL");
    puStack_3f0 = (undefined1 *)0x10e099;
    std::ostream::operator<<(local_330,std::endl<char,std::char_traits<char>>);
    puStack_3f0 = &LAB_0010e0a5;
    exit(1);
  }
  j = 0;
  do {
    local_338 = (ulong)j;
    puStack_3f0 = (undefined1 *)0x10e0ec;
    sVar13 = std::vector<fat::directory,_std::allocator<fat::directory>_>::size
                       ((vector<fat::directory,_std::allocator<fat::directory>_> *)&max_cluster_dirs
                       );
    if (sVar13 <= local_338) {
      pbVar3 = local_2b0->fs_br;
      puStack_3f0 = (undefined1 *)0x10e1f8;
      fseek((FILE *)local_2b0->fs,
            (long)(iVar8 * pbVar3->cluster_size) + 0x110 +
            (long)pbVar3->fat_copies * (long)pbVar3->usable_cluster_count * 4,0);
      sStack_24e = 0;
      local_254 = 0;
      while( true ) {
        local_358 = (ulong)local_254;
        puStack_3f0 = (undefined1 *)0x10e227;
        sVar13 = std::vector<fat::directory,_std::allocator<fat::directory>_>::size
                           ((vector<fat::directory,_std::allocator<fat::directory>_> *)
                            &max_cluster_dirs);
        if (sVar13 <= local_358) break;
        puStack_3f0 = (undefined1 *)0x10e249;
        local_360 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                              ((vector<fat::directory,_std::allocator<fat::directory>_> *)
                               &max_cluster_dirs,(long)local_254);
        puStack_3f0 = (undefined1 *)0x10e273;
        fwrite(local_360,0x18,1,(FILE *)local_2b0->fs);
        sStack_24e = sStack_24e + 0x18;
        local_254 = local_254 + 1;
      }
      puStack_3f0 = (undefined1 *)0x10e2ba;
      fwrite(&split_content.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x18,1,(FILE *)local_2b0->fs);
      sStack_24e = sStack_24e + 0x18;
      puStack_3f0 = (undefined1 *)0x10e2e2;
      memset(&local_255,0,1);
      for (local_258 = 0; (int)local_258 < (int)local_2b0->fs_br->cluster_size - (int)sStack_24e;
          local_258 = local_258 + 1) {
        puStack_3f0 = (undefined1 *)0x10e330;
        fwrite(&local_255,1,1,(FILE *)local_2b0->fs);
      }
      uVar12 = (ulong)(uint)local_2b0->fs_br->usable_cluster_count;
      lVar5 = -(uVar12 * 4 + 0xf & 0xfffffffffffffff0);
      puVar15 = (undefined1 *)((long)&local_3e8 + lVar5);
      for (i_4 = 0; i_4 < local_2b0->fs_br->usable_cluster_count; i_4 = i_4 + 1) {
        *(int32_t *)(puVar15 + (long)i_4 * 4) = local_2b0->fat_table[i_4];
      }
      i_5 = 0;
      local_370 = uVar12;
      local_368 = puVar15;
      _x = uVar12;
      __vla_expr0 = (unsigned_long)&local_3e8;
      while( true ) {
        local_378 = (ulong)i_5;
        *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e40b;
        sVar13 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)auStack_98);
        if (sVar13 <= local_378) break;
        local_380 = (long)i_5;
        *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e438;
        sVar13 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)auStack_98);
        if (local_380 == sVar13 - 1) {
          local_3a4 = local_2b0->FAT_FILE_END;
          sVar13 = (size_type)i_5;
          *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e4d5;
          pvVar14 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)auStack_98,sVar13);
          *(int32_t *)(local_368 + (long)*pvVar14 * 4) = local_3a4;
          local_3a0 = pvVar14;
        }
        else {
          iVar8 = i_5 + 1;
          *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e462;
          local_388 = std::vector<int,_std::allocator<int>_>::at
                                ((vector<int,_std::allocator<int>_> *)auStack_98,(long)iVar8);
          local_394 = *local_388;
          sVar13 = (size_type)i_5;
          *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e48d;
          pvVar14 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)auStack_98,sVar13);
          *(value_type *)(local_368 + (long)*pvVar14 * 4) = local_394;
          local_390 = pvVar14;
        }
        i_5 = i_5 + 1;
      }
      pFVar4 = (FILE *)local_2b0->fs;
      *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e525;
      fseek(pFVar4,0x110,0);
      for (local_274 = 0; __ptr = local_368, local_274 < local_2b0->fs_br->fat_copies;
          local_274 = local_274 + 1) {
        sVar11 = local_370 << 2;
        pFVar4 = (FILE *)local_2b0->fs;
        *(undefined8 *)((long)&puStack_3f0 + lVar5) = 0x10e574;
        fwrite(__ptr,sVar11,1,pFVar4);
      }
      local_278 = 0;
      while( true ) {
        local_3b0 = (ulong)local_278;
        *(undefined8 *)(puVar15 + -8) = 0x10e5ad;
        sVar13 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)auStack_98);
        if (sVar13 <= local_3b0) break;
        uVar9 = (uint)(ushort)local_2b0->fs_br->cluster_size;
        uVar12 = (ulong)uVar9;
        __s = puVar15 + -(ulong)(uVar9 + 0xf & 0xfffffff0);
        local_3c8 = uVar12;
        local_3c0 = __s;
        local_288 = uVar12;
        __vla_expr1 = (unsigned_long)puVar15;
        __s[-8] = '\t';
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        memset(__s,0,uVar12);
        sVar13 = (size_type)local_278;
        __s[-8] = '\x19';
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        local_3b8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_78,sVar13);
        __s[-8] = '.';
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        __src = (char *)std::__cxx11::string::c_str();
        pcVar10 = local_3c0;
        __s[-8] = '=';
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        strcpy(pcVar10,__src);
        pFVar4 = (FILE *)local_2b0->fs;
        cVar1 = local_2b0->fs_br->fat_copies;
        iVar8 = local_2b0->fs_br->usable_cluster_count;
        __s[-8] = 'n';
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fseek(pFVar4,(long)cVar1 * (long)iVar8 * 4 + 0x110,0);
        local_3e0 = (FILE *)local_2b0->fs;
        local_3d4 = (int)local_2b0->fs_br->cluster_size;
        sVar13 = (size_type)local_278;
        __s[-8] = -0x5a;
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        local_3d0 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)auStack_98,sVar13);
        pFVar4 = local_3e0;
        iVar8 = local_3d4 * *local_3d0;
        __s[-8] = -0x2b;
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fseek(pFVar4,(long)iVar8,1);
        pcVar10 = local_3c0;
        uVar12 = local_3c8;
        pFVar4 = (FILE *)local_2b0->fs;
        __s[-8] = -6;
        __s[-7] = -0x1a;
        __s[-6] = '\x10';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        fwrite(pcVar10,uVar12,1,pFVar4);
        local_278 = local_278 + 1;
        puVar15 = (undefined1 *)__vla_expr1;
      }
      *(undefined8 *)(puVar15 + -8) = 0x10e72d;
      this_00 = std::operator<<((ostream *)&std::cout,"OK");
      local_3e8 = this_00;
      *(undefined8 *)(puVar15 + -8) = 0x10e749;
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      uVar6 = __vla_expr0;
      *(undefined8 *)(__vla_expr0 - 8) = 0x10e761;
      std::vector<fat::directory,_std::allocator<fat::directory>_>::~vector
                ((vector<fat::directory,_std::allocator<fat::directory>_> *)&max_cluster_dirs);
      *(undefined8 *)(uVar6 - 8) = 0x10e76d;
      std::__cxx11::string::~string((string *)local_1e8);
      *(undefined8 *)(uVar6 - 8) = 0x10e779;
      std::__cxx11::string::~string(local_1a8);
      *(undefined8 *)(uVar6 - 8) = 0x10e785;
      std::__cxx11::string::~string(local_168);
      *(undefined8 *)(uVar6 - 8) = 0x10e791;
      std::__cxx11::string::~string(local_148);
      *(undefined8 *)(uVar6 - 8) = 0x10e79d;
      std::__cxx11::string::~string((string *)&NumSubstrings);
      *(undefined8 *)(uVar6 - 8) = 0x10e7a9;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)auStack_98);
      *(undefined8 *)(uVar6 - 8) = 0x10e7b2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_78);
      *(undefined8 *)(uVar6 - 8) = 0x10e7bb;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return;
    }
    puStack_3f0 = (undefined1 *)0x10e112;
    local_340 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                          ((vector<fat::directory,_std::allocator<fat::directory>_> *)
                           &max_cluster_dirs,(long)j);
    puStack_3f0 = (undefined1 *)0x10e127;
    pcVar10 = (char *)std::__cxx11::string::c_str();
    puStack_3f0 = (undefined1 *)0x10e136;
    iVar7 = strcmp(local_340->name,pcVar10);
    if (iVar7 == 0) {
      puStack_3f0 = (undefined1 *)0x10e14e;
      local_348 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                            ((vector<fat::directory,_std::allocator<fat::directory>_> *)
                             &max_cluster_dirs,(long)j);
      if ((local_348->is_file & 1U) != 0) {
        puStack_3f0 = (undefined1 *)0x10e177;
        local_350 = std::operator<<((ostream *)&std::cout,"NAME ALREADY EXISTS");
        puStack_3f0 = (undefined1 *)0x10e193;
        std::ostream::operator<<(local_350,std::endl<char,std::char_traits<char>>);
        puStack_3f0 = (undefined1 *)0x10e19f;
        exit(1);
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

void fat::create_new_file(std::string file_path, std::string fat_path) {
    FILE *fnew;
    std::vector<std::string> result = explode(fat_path, '/');

    struct directory root;
    std::vector<std::string> split_content = std::vector<std::string>();
    std::vector<int32_t> free_clusters = std::vector<int32_t>();

    // ---
    // Reading the input file and storing its content into a string vector
    // ---
    if((fnew = fopen(file_path.c_str(), "r")) == NULL){
        std::cout << "FILE NOT FOUND" << std::endl;
        exit(1);
    }
    fseek(fnew, 0, SEEK_END);
    long fsize = ftell(fnew);
    fseek(fnew, 0, SEEK_SET);
    std::string content(fsize, '\0');
    fread(&content[0], fsize, 1, fnew);
    fclose(fnew);
    int NumSubstrings = content.length() / fs_br->cluster_size;
    for (auto i = 0; i < NumSubstrings; i++) {
        split_content.push_back(content.substr(i * fs_br->cluster_size, fs_br->cluster_size));
    }
    if (content.length() % fs_br->cluster_size != 0) {
        split_content.push_back(content.substr(fs_br->cluster_size * NumSubstrings));
    }

    for (int i = 0; i < split_content.size(); i++) {
        free_clusters.push_back(get_first_free_cluster());
    }
    assert(free_clusters.size() == split_content.size());

    // ---
    // Updating the parent directory content
    // ---
    std::string file_name = file_path.substr(file_path.find_last_of("/") + 1);
    std::string name = file_name.substr(0, file_name.find_last_of(".")).substr(0,8);
    std::string extension = file_name.substr(file_name.find_last_of(".") + 1).substr(0,3);
    std::string cropped_file_name = name + "." + extension;

    memset(root.name, '\0', sizeof(root.name));
    root.is_file = 1;
    strcpy(root.name, cropped_file_name.c_str());
    root.size = fsize;
    root.start_cluster = free_clusters.at(0);

    int32_t parent = get_parent_cluster(result);
    if (parent < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }
    std::vector<fat::directory> children = get_dir_children(parent);
    long max_cluster_dirs = fs_br->cluster_size / sizeof(struct directory);
    if(children.size() >= max_cluster_dirs){
        std::cout << "DIRECTORY IS FULL" << std::endl;
        exit(1);
    }
    for(int i = 0; i < children.size(); i++){
        if((strcmp(children.at(i).name, cropped_file_name.c_str()) == 0) && children.at(i).is_file){
            std::cout << "NAME ALREADY EXISTS" << std::endl;
            exit(1);
        }
    }
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < children.size(); j++) {
        fwrite(&children.at(j), sizeof(directory), 1, fs);
        ac_size += sizeof(directory);
    }
    fwrite(&root, sizeof(root), 1, fs);
    ac_size += sizeof(directory);
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    for (int x = 0; x < free_clusters.size(); x++) {
        if (x != free_clusters.size() - 1) {
            new_fat[free_clusters.at(x)] = free_clusters.at(x + 1);
        } else {
            new_fat[free_clusters.at(x)] = FAT_FILE_END;
        }
    }
    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Inserting the input file content into FAT clusters
    // ---
    for (int i = 0; i < free_clusters.size(); i++) {
        char cluster[fs_br->cluster_size];
        memset(cluster, '\0', sizeof(cluster));
        strcpy(cluster, split_content.at(i).c_str());

        fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count)),
              SEEK_SET);
        fseek(fs, fs_br->cluster_size * free_clusters.at(i), SEEK_CUR);
        fwrite(&cluster, sizeof(cluster), 1, fs);
    }
    std::cout << "OK" << std::endl;
}